

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemmodel.cpp
# Opt level: O0

void QAbstractItemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint uVar1;
  uint uVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  QFlagsStorage<Qt::MatchFlag> QVar7;
  QMetaType QVar8;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QAbstractItemModel *in_RDI;
  long in_FS_OFFSET;
  bool _r_39;
  bool _r_38;
  bool _r_37;
  bool _r_36;
  bool _r_35;
  bool _r_34;
  bool _r_33;
  bool _r_32;
  bool _r_31;
  bool _r_30;
  bool _r_29;
  bool _r_28;
  bool _r_27;
  bool _r_26;
  bool _r_25;
  bool _r_24;
  bool _r_23;
  bool _r_22;
  bool _r_21;
  bool _r_20;
  bool _r_19;
  bool _r_16;
  bool _r_15;
  bool _r_12;
  bool _r_11;
  int _r_10;
  int _r_9;
  int _r_8;
  int _r_7;
  bool _r_2;
  bool _r_1;
  bool _r;
  QAbstractItemModel *_t;
  QModelIndexList _r_43;
  QModelIndexList _r_42;
  QModelIndexList _r_41;
  ItemFlags _r_40;
  QModelIndex _r_6;
  QModelIndex _r_5;
  QModelIndex _r_4;
  QModelIndex _r_3;
  QVariant _r_18;
  QVariant _r_17;
  QVariant _r_14;
  QVariant _r_13;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 uVar9;
  int in_stack_fffffffffffffa1c;
  enum_type in_stack_fffffffffffffa20;
  enum_type in_stack_fffffffffffffa24;
  int in_stack_fffffffffffffa28;
  Orientation in_stack_fffffffffffffa2c;
  QAbstractItemModel *in_stack_fffffffffffffa30;
  QAbstractItemModel *in_stack_fffffffffffffa38;
  undefined8 uVar10;
  QMetaType local_2e8;
  QMetaType local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined4 local_2a4;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  int local_284;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 local_148 [24];
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      dataChanged(in_stack_fffffffffffffa30,
                  (QModelIndex *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                  (QModelIndex *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                  (QList<int> *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
      break;
    case 1:
      local_a8 = 0;
      uStack_a0 = 0;
      local_98 = 0;
      QList<int>::QList((QList<int> *)0x7f973c);
      dataChanged(in_stack_fffffffffffffa30,
                  (QModelIndex *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                  (QModelIndex *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                  (QList<int> *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
      QList<int>::~QList((QList<int> *)0x7f9770);
      break;
    case 2:
      headerDataChanged((QAbstractItemModel *)
                        CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                        in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28,
                        in_stack_fffffffffffffa24);
      break;
    case 3:
      layoutChanged((QAbstractItemModel *)
                    CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                    (QList<QPersistentModelIndex> *)
                    CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                    in_stack_fffffffffffffa2c);
      break;
    case 4:
      layoutChanged((QAbstractItemModel *)
                    CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                    (QList<QPersistentModelIndex> *)
                    CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                    in_stack_fffffffffffffa2c);
      break;
    case 5:
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x7f9863);
      layoutChanged((QAbstractItemModel *)
                    CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                    (QList<QPersistentModelIndex> *)
                    CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                    in_stack_fffffffffffffa2c);
      QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x7f9889);
      break;
    case 6:
      layoutAboutToBeChanged
                ((QAbstractItemModel *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20)
                 ,(QList<QPersistentModelIndex> *)
                  CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa2c);
      break;
    case 7:
      layoutAboutToBeChanged
                ((QAbstractItemModel *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20)
                 ,(QList<QPersistentModelIndex> *)
                  CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa2c);
      break;
    case 8:
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x7f9940);
      layoutAboutToBeChanged
                ((QAbstractItemModel *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20)
                 ,(QList<QPersistentModelIndex> *)
                  CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa2c);
      QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x7f9966);
      break;
    case 9:
      rowsAboutToBeInserted(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 10:
      rowsInserted(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0xb:
      rowsAboutToBeRemoved(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0xc:
      rowsRemoved(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0xd:
      columnsAboutToBeInserted(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0xe:
      columnsInserted(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0xf:
      columnsAboutToBeRemoved(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0x10:
      columnsRemoved(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0x11:
      modelAboutToBeReset(in_RDI);
      break;
    case 0x12:
      modelReset(in_RDI);
      break;
    case 0x13:
      rowsAboutToBeMoved(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10),
                         **(undefined4 **)(in_RCX + 0x18),*(undefined8 *)(in_RCX + 0x20),
                         **(undefined4 **)(in_RCX + 0x28));
      break;
    case 0x14:
      rowsMoved(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10),
                **(undefined4 **)(in_RCX + 0x18),*(undefined8 *)(in_RCX + 0x20),
                **(undefined4 **)(in_RCX + 0x28));
      break;
    case 0x15:
      columnsAboutToBeMoved
                (in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10),
                 **(undefined4 **)(in_RCX + 0x18),*(undefined8 *)(in_RCX + 0x20),
                 **(undefined4 **)(in_RCX + 0x28));
      break;
    case 0x16:
      columnsMoved(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10),
                   **(undefined4 **)(in_RCX + 0x18),*(undefined8 *)(in_RCX + 0x20),
                   **(undefined4 **)(in_RCX + 0x28));
      break;
    case 0x17:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x2e])();
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x18:
      (*(in_RDI->super_QObject)._vptr_QObject[0x2f])();
      break;
    case 0x19:
      (*(in_RDI->super_QObject)._vptr_QObject[0x30])();
      break;
    case 0x1a:
      bVar5 = hasIndex(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
                       (int)in_stack_fffffffffffffa30,
                       (QModelIndex *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28))
      ;
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x1b:
      QModelIndex::QModelIndex((QModelIndex *)0x7f9dfc);
      bVar5 = hasIndex(in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
                       (int)in_stack_fffffffffffffa30,
                       (QModelIndex *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28))
      ;
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x1c:
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      local_110 = &DAT_aaaaaaaaaaaaaaaa;
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      (*(in_RDI->super_QObject)._vptr_QObject[0xc])
                (&local_118,in_RDI,(ulong)**(uint **)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10),
                 *(undefined8 *)(in_RCX + 0x18));
      if (*(long *)in_RCX != 0) {
        puVar3 = *(undefined8 **)in_RCX;
        *puVar3 = local_118;
        puVar3[1] = local_110;
        puVar3[2] = local_108;
      }
      break;
    case 0x1d:
      local_130 = &DAT_aaaaaaaaaaaaaaaa;
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      local_120 = &DAT_aaaaaaaaaaaaaaaa;
      uVar2 = **(uint **)(in_RCX + 8);
      uVar1 = **(uint **)(in_RCX + 0x10);
      QModelIndex::QModelIndex((QModelIndex *)0x7f9f72);
      (*(in_RDI->super_QObject)._vptr_QObject[0xc])
                (&local_130,in_RDI,(ulong)uVar2,(ulong)uVar1,local_148);
      if (*(long *)in_RCX != 0) {
        puVar3 = *(undefined8 **)in_RCX;
        *puVar3 = local_130;
        puVar3[1] = local_128;
        puVar3[2] = local_120;
      }
      break;
    case 0x1e:
      local_160 = &DAT_aaaaaaaaaaaaaaaa;
      local_158 = &DAT_aaaaaaaaaaaaaaaa;
      local_150 = &DAT_aaaaaaaaaaaaaaaa;
      (*(in_RDI->super_QObject)._vptr_QObject[0xd])(&local_160,in_RDI,*(undefined8 *)(in_RCX + 8));
      if (*(long *)in_RCX != 0) {
        puVar3 = *(undefined8 **)in_RCX;
        *puVar3 = local_160;
        puVar3[1] = local_158;
        puVar3[2] = local_150;
      }
      break;
    case 0x1f:
      local_178 = &DAT_aaaaaaaaaaaaaaaa;
      local_170 = &DAT_aaaaaaaaaaaaaaaa;
      local_168 = &DAT_aaaaaaaaaaaaaaaa;
      (*(in_RDI->super_QObject)._vptr_QObject[0xe])
                (&local_178,in_RDI,(ulong)**(uint **)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10),
                 *(undefined8 *)(in_RCX + 0x18));
      if (*(long *)in_RCX != 0) {
        puVar3 = *(undefined8 **)in_RCX;
        *puVar3 = local_178;
        puVar3[1] = local_170;
        puVar3[2] = local_168;
      }
      break;
    case 0x20:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0xf])();
      if (*(long *)in_RCX != 0) {
        **(int **)in_RCX = iVar6;
      }
      break;
    case 0x21:
      QModelIndex::QModelIndex((QModelIndex *)0x7fa180);
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0xf])();
      if (*(long *)in_RCX != 0) {
        **(int **)in_RCX = iVar6;
      }
      break;
    case 0x22:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x10])();
      if (*(long *)in_RCX != 0) {
        **(int **)in_RCX = iVar6;
      }
      break;
    case 0x23:
      QModelIndex::QModelIndex((QModelIndex *)0x7fa22c);
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x10])();
      if (*(long *)in_RCX != 0) {
        **(int **)in_RCX = iVar6;
      }
      break;
    case 0x24:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x11])();
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x25:
      QModelIndex::QModelIndex((QModelIndex *)0x7fa2e0);
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x11])();
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x26:
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      (*(in_RDI->super_QObject)._vptr_QObject[0x12])(&local_28,in_RDI,*(undefined8 *)(in_RCX + 8));
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                   (QVariant *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      }
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      break;
    case 0x27:
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      (*(in_RDI->super_QObject)._vptr_QObject[0x12])(&local_48,in_RDI,*(undefined8 *)(in_RCX + 8));
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                   (QVariant *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      }
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      break;
    case 0x28:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x13])
                        (in_RDI,*(undefined8 *)(in_RCX + 8),*(undefined8 *)(in_RCX + 0x10));
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x29:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x13])
                        (in_RDI,*(undefined8 *)(in_RCX + 8),*(undefined8 *)(in_RCX + 0x10));
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x2a:
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      (*(in_RDI->super_QObject)._vptr_QObject[0x14])
                (&local_68,in_RDI,(ulong)**(uint **)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10),
                 (ulong)**(uint **)(in_RCX + 0x18));
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                   (QVariant *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      }
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      break;
    case 0x2b:
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      (*(in_RDI->super_QObject)._vptr_QObject[0x14])
                (&local_88,in_RDI,(ulong)**(uint **)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10),0
                );
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                   (QVariant *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      }
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      break;
    case 0x2c:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x1f])
                        (in_RDI,(ulong)**(uint **)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10));
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x2d:
      uVar2 = **(uint **)(in_RCX + 8);
      uVar1 = **(uint **)(in_RCX + 0x10);
      QModelIndex::QModelIndex((QModelIndex *)0x7fa750);
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x1f])(in_RDI,(ulong)uVar2,(ulong)uVar1);
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x2e:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x20])
                        (in_RDI,(ulong)**(uint **)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10));
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x2f:
      uVar2 = **(uint **)(in_RCX + 8);
      uVar1 = **(uint **)(in_RCX + 0x10);
      QModelIndex::QModelIndex((QModelIndex *)0x7fa85d);
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x20])(in_RDI,(ulong)uVar2,(ulong)uVar1);
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x30:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x21])
                        (in_RDI,(ulong)**(uint **)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10));
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x31:
      uVar2 = **(uint **)(in_RCX + 8);
      uVar1 = **(uint **)(in_RCX + 0x10);
      QModelIndex::QModelIndex((QModelIndex *)0x7fa96a);
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x21])(in_RDI,(ulong)uVar2,(ulong)uVar1);
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x32:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x22])
                        (in_RDI,(ulong)**(uint **)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10));
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x33:
      uVar2 = **(uint **)(in_RCX + 8);
      uVar1 = **(uint **)(in_RCX + 0x10);
      QModelIndex::QModelIndex((QModelIndex *)0x7faa77);
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x22])(in_RDI,(ulong)uVar2,(ulong)uVar1);
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x34:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x23])
                        (in_RDI,*(undefined8 *)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10),
                         (ulong)**(uint **)(in_RCX + 0x18),*(undefined8 *)(in_RCX + 0x20),
                         (ulong)**(uint **)(in_RCX + 0x28));
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x35:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x24])
                        (in_RDI,*(undefined8 *)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10),
                         (ulong)**(uint **)(in_RCX + 0x18),*(undefined8 *)(in_RCX + 0x20),
                         (ulong)**(uint **)(in_RCX + 0x28));
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x36:
      bVar5 = insertRow((QAbstractItemModel *)
                        CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        in_stack_fffffffffffffa1c,(QModelIndex *)0x7fac06);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x37:
      QModelIndex::QModelIndex((QModelIndex *)0x7fac6b);
      bVar5 = insertRow((QAbstractItemModel *)
                        CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        in_stack_fffffffffffffa1c,(QModelIndex *)0x7fac87);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x38:
      bVar5 = insertColumn((QAbstractItemModel *)
                           CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                           in_stack_fffffffffffffa1c,(QModelIndex *)0x7face1);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x39:
      QModelIndex::QModelIndex((QModelIndex *)0x7fad46);
      bVar5 = insertColumn((QAbstractItemModel *)
                           CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                           in_stack_fffffffffffffa1c,(QModelIndex *)0x7fad62);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x3a:
      bVar5 = removeRow((QAbstractItemModel *)
                        CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        in_stack_fffffffffffffa1c,(QModelIndex *)0x7fadbc);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x3b:
      QModelIndex::QModelIndex((QModelIndex *)0x7fae1b);
      bVar5 = removeRow((QAbstractItemModel *)
                        CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        in_stack_fffffffffffffa1c,(QModelIndex *)0x7fae31);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x3c:
      bVar5 = removeColumn((QAbstractItemModel *)
                           CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                           in_stack_fffffffffffffa1c,(QModelIndex *)0x7fae8b);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x3d:
      QModelIndex::QModelIndex((QModelIndex *)0x7faeea);
      bVar5 = removeColumn((QAbstractItemModel *)
                           CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                           in_stack_fffffffffffffa1c,(QModelIndex *)0x7faf00);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x3e:
      bVar5 = moveRow(in_stack_fffffffffffffa30,
                      (QModelIndex *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                      in_stack_fffffffffffffa24,
                      (QModelIndex *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),0
                     );
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x3f:
      bVar5 = moveColumn(in_stack_fffffffffffffa30,
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                         in_stack_fffffffffffffa24,
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),0);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar5;
      }
      break;
    case 0x40:
      (*(in_RDI->super_QObject)._vptr_QObject[0x25])();
      break;
    case 0x41:
      iVar6 = (*(in_RDI->super_QObject)._vptr_QObject[0x26])();
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar6 & 1;
      }
      break;
    case 0x42:
      local_284 = 0xaaaaaaaa;
      local_284 = (*(in_RDI->super_QObject)._vptr_QObject[0x27])();
      if (*(long *)in_RCX != 0) {
        **(int **)in_RCX = local_284;
      }
      break;
    case 0x43:
      (*(in_RDI->super_QObject)._vptr_QObject[0x28])
                (in_RDI,(ulong)**(uint **)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10));
      break;
    case 0x44:
      (*(in_RDI->super_QObject)._vptr_QObject[0x28])(in_RDI,(ulong)**(uint **)(in_RCX + 8),0);
      break;
    case 0x45:
      local_2a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_298 = &DAT_aaaaaaaaaaaaaaaa;
      local_290 = &DAT_aaaaaaaaaaaaaaaa;
      uVar9 = **(undefined4 **)(in_RCX + 0x28);
      local_2a4 = uVar9;
      (*(in_RDI->super_QObject)._vptr_QObject[0x2a])
                (&local_2a0,in_RDI,*(undefined8 *)(in_RCX + 8),(ulong)**(uint **)(in_RCX + 0x10),
                 *(undefined8 *)(in_RCX + 0x18),(ulong)**(uint **)(in_RCX + 0x20));
      if (*(long *)in_RCX != 0) {
        QList<QModelIndex>::operator=
                  ((QList<QModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffa1c,uVar9));
      }
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x7fb20e);
      break;
    case 0x46:
      local_2c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_2b0 = &DAT_aaaaaaaaaaaaaaaa;
      uVar10 = *(undefined8 *)(in_RCX + 8);
      uVar2 = **(uint **)(in_RCX + 0x10);
      uVar4 = *(undefined8 *)(in_RCX + 0x18);
      uVar1 = **(uint **)(in_RCX + 0x20);
      QVar7.i = (Int)Qt::operator|(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20);
      (*(in_RDI->super_QObject)._vptr_QObject[0x2a])
                (&local_2c0,in_RDI,uVar10,(ulong)uVar2,uVar4,(ulong)uVar1);
      if (*(long *)in_RCX != 0) {
        QList<QModelIndex>::operator=
                  ((QList<QModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffa1c,QVar7.i));
      }
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x7fb311);
      break;
    case 0x47:
      local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
      local_2d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
      uVar10 = *(undefined8 *)(in_RCX + 8);
      uVar2 = **(uint **)(in_RCX + 0x10);
      uVar4 = *(undefined8 *)(in_RCX + 0x18);
      QVar7.i = (Int)Qt::operator|(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20);
      (*(in_RDI->super_QObject)._vptr_QObject[0x2a])(&local_2d8,in_RDI,uVar10,(ulong)uVar2,uVar4,1);
      if (*(long *)in_RCX != 0) {
        QList<QModelIndex>::operator=
                  ((QList<QModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffa1c,QVar7.i));
      }
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x7fb403);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 0) {
      if (**(int **)(in_RCX + 8) == 2) {
        QVar8 = QMetaType::fromType<QList<int>>();
        **(undefined8 **)in_RCX = QVar8.d_ptr;
      }
      else {
        memset(&local_2e8,0,8);
        QMetaType::QMetaType(&local_2e8);
        **(undefined8 **)in_RCX = local_2e8.d_ptr;
      }
    }
    else {
      memset(&local_2e0,0,8);
      QMetaType::QMetaType(&local_2e0);
      **(undefined8 **)in_RCX = local_2e0.d_ptr;
    }
  }
  if (((((((in_ESI == 5) &&
          (bVar5 = QtMocHelpers::
                   indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&)>
                             (in_RCX,(void **)dataChanged,0,0), !bVar5)) &&
         (bVar5 = QtMocHelpers::indexOfMethod<void(QAbstractItemModel::*)(Qt::Orientation,int,int)>
                            (in_RCX,(void **)headerDataChanged,0,2), !bVar5)) &&
        ((bVar5 = QtMocHelpers::
                  indexOfMethod<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
                            (in_RCX,(void **)layoutChanged,0,3), !bVar5 &&
         (bVar5 = QtMocHelpers::
                  indexOfMethod<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
                            (in_RCX,(void **)layoutAboutToBeChanged,0,6), !bVar5)))) &&
       ((bVar5 = QtMocHelpers::
                 indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                           (in_RCX,(void **)rowsAboutToBeInserted,0,9), !bVar5 &&
        ((bVar5 = QtMocHelpers::
                  indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                            (in_RCX,(void **)rowsInserted,0,10), !bVar5 &&
         (bVar5 = QtMocHelpers::
                  indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                            (in_RCX,(void **)rowsAboutToBeRemoved,0,0xb), !bVar5)))))) &&
      (bVar5 = QtMocHelpers::
               indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                         (in_RCX,(void **)rowsRemoved,0,0xc), !bVar5)) &&
     (((((bVar5 = QtMocHelpers::
                  indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                            (in_RCX,(void **)columnsAboutToBeInserted,0,0xd), !bVar5 &&
         (bVar5 = QtMocHelpers::
                  indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                            (in_RCX,(void **)columnsInserted,0,0xe), !bVar5)) &&
        (bVar5 = QtMocHelpers::
                 indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                           (in_RCX,(void **)columnsAboutToBeRemoved,0,0xf), !bVar5)) &&
       (((bVar5 = QtMocHelpers::
                  indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal)>
                            (in_RCX,(void **)columnsRemoved,0,0x10), !bVar5 &&
         (bVar5 = QtMocHelpers::
                  indexOfMethod<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal)>
                            (in_RCX,(void **)modelAboutToBeReset,0,0x11), !bVar5)) &&
        ((bVar5 = QtMocHelpers::
                  indexOfMethod<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal)>
                            (in_RCX,(void **)modelReset,0,0x12), !bVar5 &&
         ((bVar5 = QtMocHelpers::
                   indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal)>
                             (in_RCX,(void **)rowsAboutToBeMoved,0,0x13), !bVar5 &&
          (bVar5 = QtMocHelpers::
                   indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal)>
                             (in_RCX,(void **)rowsMoved,0,0x14), !bVar5)))))))) &&
      (bVar5 = QtMocHelpers::
               indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal)>
                         (in_RCX,(void **)columnsAboutToBeMoved,0,0x15), !bVar5)))) {
    QtMocHelpers::
    indexOfMethod<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal)>
              (in_RCX,(void **)columnsMoved,0,0x16);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        case 1: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 2: _t->headerDataChanged((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 3: _t->layoutChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemModel::LayoutChangeHint>>(_a[2]))); break;
        case 4: _t->layoutChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1]))); break;
        case 5: _t->layoutChanged(); break;
        case 6: _t->layoutAboutToBeChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemModel::LayoutChangeHint>>(_a[2]))); break;
        case 7: _t->layoutAboutToBeChanged((*reinterpret_cast< std::add_pointer_t<QList<QPersistentModelIndex>>>(_a[1]))); break;
        case 8: _t->layoutAboutToBeChanged(); break;
        case 9: _t->rowsAboutToBeInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 10: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 11: _t->rowsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 12: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 13: _t->columnsAboutToBeInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 14: _t->columnsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 15: _t->columnsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 16: _t->columnsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])), QPrivateSignal()); break;
        case 17: _t->modelAboutToBeReset(QPrivateSignal()); break;
        case 18: _t->modelReset(QPrivateSignal()); break;
        case 19: _t->rowsAboutToBeMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 20: _t->rowsMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 21: _t->columnsAboutToBeMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 22: _t->columnsMoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])), QPrivateSignal()); break;
        case 23: { bool _r = _t->submit();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 24: _t->revert(); break;
        case 25: _t->resetInternalData(); break;
        case 26: { bool _r = _t->hasIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 27: { bool _r = _t->hasIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 28: { QModelIndex _r = _t->index((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 29: { QModelIndex _r = _t->index((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 30: { QModelIndex _r = _t->parent((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 31: { QModelIndex _r = _t->sibling((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndex*>(_a[0]) = std::move(_r); }  break;
        case 32: { int _r = _t->rowCount((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 33: { int _r = _t->rowCount();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 34: { int _r = _t->columnCount((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 35: { int _r = _t->columnCount();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 36: { bool _r = _t->hasChildren((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 37: { bool _r = _t->hasChildren();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 38: { QVariant _r = _t->data((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 39: { QVariant _r = _t->data((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 40: { bool _r = _t->setData((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 41: { bool _r = _t->setData((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 42: { QVariant _r = _t->headerData((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 43: { QVariant _r = _t->headerData((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 44: { bool _r = _t->insertRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 45: { bool _r = _t->insertRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 46: { bool _r = _t->insertColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 47: { bool _r = _t->insertColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 48: { bool _r = _t->removeRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 49: { bool _r = _t->removeRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 50: { bool _r = _t->removeColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 51: { bool _r = _t->removeColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 52: { bool _r = _t->moveRows((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 53: { bool _r = _t->moveColumns((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[5])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 54: { bool _r = _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 55: { bool _r = _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 56: { bool _r = _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 57: { bool _r = _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 58: { bool _r = _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 59: { bool _r = _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 60: { bool _r = _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 61: { bool _r = _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 62: { bool _r = _t->moveRow((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 63: { bool _r = _t->moveColumn((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 64: _t->fetchMore((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 65: { bool _r = _t->canFetchMore((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 66: { Qt::ItemFlags _r = _t->flags((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< Qt::ItemFlags*>(_a[0]) = std::move(_r); }  break;
        case 67: _t->sort((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 68: _t->sort((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 69: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<Qt::MatchFlags>>(_a[5])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 70: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 71: { QModelIndexList _r = _t->match((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , const QModelIndex & , const QList<int> & )>(_a, &QAbstractItemModel::dataChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(Qt::Orientation , int , int )>(_a, &QAbstractItemModel::headerDataChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QList<QPersistentModelIndex> & , QAbstractItemModel::LayoutChangeHint )>(_a, &QAbstractItemModel::layoutChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QList<QPersistentModelIndex> & , QAbstractItemModel::LayoutChangeHint )>(_a, &QAbstractItemModel::layoutAboutToBeChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeInserted, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsInserted, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeRemoved, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsRemoved, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeInserted, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsInserted, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeRemoved, 15))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsRemoved, 16))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(QPrivateSignal)>(_a, &QAbstractItemModel::modelAboutToBeReset, 17))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(QPrivateSignal)>(_a, &QAbstractItemModel::modelReset, 18))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsAboutToBeMoved, 19))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::rowsMoved, 20))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsAboutToBeMoved, 21))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemModel::*)(const QModelIndex & , int , int , const QModelIndex & , int , QPrivateSignal)>(_a, &QAbstractItemModel::columnsMoved, 22))
            return;
    }
}